

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O3

bool __thiscall
glcts::TessellationShaderPrimitiveCoverage::verifyDrawBufferContents
          (TessellationShaderPrimitiveCoverage *this)

{
  GLubyte GVar1;
  GLubyte GVar2;
  GLubyte GVar3;
  GLubyte GVar4;
  GLubyte *pGVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  ulong uVar9;
  bool bVar10;
  GLubyte rendered_result_ubyte [4];
  GLubyte expected_result_ubyte [4];
  GLubyte local_1ba;
  char local_1b9;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  long lVar8;
  
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar8 + 0x1218))(0x8ce0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glReadBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2a9);
  (**(code **)(lVar8 + 0x1220))(0,0,0x800,0x800,0x1908,0x1401,this->m_rendered_data_buffer);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glReadPixels() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2b0);
  pGVar5 = this->m_rendered_data_buffer;
  uVar9 = 0;
  do {
    local_1b4 = 0x204080ff;
    GVar1 = pGVar5[uVar9];
    GVar2 = pGVar5[uVar9 + 1];
    GVar3 = pGVar5[uVar9 + 2];
    GVar4 = pGVar5[uVar9 + 3];
    local_1b8 = CONCAT13(GVar4,CONCAT12(GVar3,CONCAT11(GVar2,GVar1)));
    local_1b9 = local_1b8 != 0x204080ff;
    if ((bool)local_1b9) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Rendered pixel at index (",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") of value (",0xc);
      local_1ba = GVar1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ba,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      local_1ba = GVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ba,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      local_1ba = GVar3;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ba,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      local_1ba = GVar4;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ba,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,") does not match expected pixel (",0x21);
      local_1ba = 0xff;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ba,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      local_1ba = 0x80;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ba,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      local_1ba = '@';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ba,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      local_1ba = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1ba,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      break;
    }
    bVar10 = uVar9 < 0x3ffffc;
    uVar9 = uVar9 + 4;
  } while (bVar10);
  return local_1b9 == '\0';
}

Assistant:

bool TessellationShaderPrimitiveCoverage::verifyDrawBufferContents(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch the data */
	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer() failed");

	gl.readPixels(0,						  /* x */
				  0,						  /* y */
				  m_height, m_width, GL_RGBA, /* format */
				  GL_UNSIGNED_BYTE,			  /* type */
				  m_rendered_data_buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed");

	/* Verify result data */
	bool result = true;

	for (glw::GLuint n_pixel = 0; n_pixel < (m_rendered_data_buffer_size >> 2); n_pixel += m_n_components)
	{
		glw::GLubyte expected_result_ubyte[] = { (glw::GLubyte)(m_clear_color[0] * 255.0f),
												 (glw::GLubyte)(m_clear_color[1] * 255.0f),
												 (glw::GLubyte)(m_clear_color[2] * 255.0f),
												 (glw::GLubyte)(m_clear_color[3] * 255.0f) };
		glw::GLubyte rendered_result_ubyte[] = { m_rendered_data_buffer[n_pixel + 0],
												 m_rendered_data_buffer[n_pixel + 1],
												 m_rendered_data_buffer[n_pixel + 2],
												 m_rendered_data_buffer[n_pixel + 3] };

		if (memcmp(expected_result_ubyte, rendered_result_ubyte, sizeof(rendered_result_ubyte)) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Rendered pixel at index (" << n_pixel << ") of value"
																									 " ("
							   << rendered_result_ubyte[0] << ", " << rendered_result_ubyte[1] << ", "
							   << rendered_result_ubyte[2] << ", " << rendered_result_ubyte[3]
							   << ") does not match expected pixel"
								  " ("
							   << expected_result_ubyte[0] << ", " << expected_result_ubyte[1] << ", "
							   << expected_result_ubyte[2] << ", " << expected_result_ubyte[3] << ")"
							   << tcu::TestLog::EndMessage;

			result = false;

			break;
		} /* if (rendered pixel is invalid) */
	}	 /* for (all pixels) */

	return result;
}